

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::TestRpcEnv::TestRpcEnv
          (TestRpcEnv *this,Maybe<kj::Promise<void>_> *revokePromise)

{
  AsyncIoStream *connection;
  _func_int *p_Var1;
  int iVar2;
  MembranePolicy *pMVar3;
  undefined1 local_d0 [24];
  NullableValue<kj::Promise<void>_> local_b8;
  undefined8 local_a8;
  Own<capnp::_::(anonymous_namespace)::MembranePolicyImpl,_std::nullptr_t> local_a0;
  Own<capnp::_::(anonymous_namespace)::TestMembraneImpl,_std::nullptr_t> local_90;
  undefined1 local_80 [8];
  Own<capnp::ClientHook,_std::nullptr_t> local_78;
  Own<capnp::ClientHook,_std::nullptr_t> local_68;
  Own<capnp::MembranePolicy,_std::nullptr_t> local_58;
  Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> local_48;
  
  kj::EventLoop::EventLoop(&this->loop);
  kj::WaitScope::WaitScope(&this->waitScope,&this->loop);
  local_a8 = &this->waitScope;
  kj::newTwoWayPipe();
  TwoPartyClient::TwoPartyClient(&this->client,(this->pipe).ends[0].ptr);
  connection = (this->pipe).ends[1].ptr;
  kj::heap<capnp::_::(anonymous_namespace)::TestMembraneImpl>();
  pMVar3 = (MembranePolicy *)operator_new(0xc0);
  kj::Maybe<kj::Promise<void>_>::Maybe((Maybe<kj::Promise<void>_> *)&local_b8,revokePromise);
  (pMVar3->wrappers).table.rows.builder.endPtr = (Entry *)0x0;
  (pMVar3->wrappers).table.rows.builder.ptr = (Entry *)0x0;
  (pMVar3->wrappers).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)0x0;
  (pMVar3->wrappers).table.rows.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance
  ;
  (pMVar3->wrappers).table.indexes.erasedCount = 0;
  (pMVar3->wrappers).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (pMVar3->reverseWrappers).table.rows.builder.endPtr = (Entry *)0x0;
  (pMVar3->wrappers).table.indexes.buckets.size_ = 0;
  (pMVar3->wrappers).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (pMVar3->reverseWrappers).table.rows.builder.ptr = (Entry *)0x0;
  (pMVar3->reverseWrappers).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)0x0;
  (pMVar3->reverseWrappers).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (pMVar3->reverseWrappers).table.indexes.erasedCount = 0;
  (pMVar3->reverseWrappers).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (pMVar3->reverseWrappers).table.indexes.buckets.size_ = 0;
  (pMVar3->reverseWrappers).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  *(undefined4 *)&pMVar3[1].wrappers.table.rows.builder.ptr = 0;
  pMVar3->_vptr_MembranePolicy = (_func_int **)&PTR_inboundCall_0064d298;
  pMVar3[1]._vptr_MembranePolicy = (_func_int **)&PTR_disposeImpl_0064d310;
  if (local_b8.isSet == false) {
    *(undefined1 *)&pMVar3[1].wrappers.table.rows.builder.pos = 0;
    iVar2 = 1;
  }
  else {
    local_d0._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++"
    ;
    local_d0._8_8_ = "operator()";
    local_d0._16_8_ = (_func_int **)0x4b00000065;
    kj::Promise<void>::fork((Promise<void> *)&local_48);
    *(undefined1 *)&pMVar3[1].wrappers.table.rows.builder.pos = 1;
    pMVar3[1].wrappers.table.rows.builder.endPtr = (Entry *)local_48.disposer;
    pMVar3[1].wrappers.table.rows.builder.disposer = (ArrayDisposer *)local_48.ptr;
    local_48.ptr = (ForkHub<kj::_::Void> *)0x0;
    kj::Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose(&local_48);
    iVar2 = *(int *)&pMVar3[1].wrappers.table.rows.builder.ptr + 1;
  }
  *(int *)&pMVar3[1].wrappers.table.rows.builder.ptr = iVar2;
  local_a0.disposer = (Disposer *)(pMVar3 + 1);
  kj::_::NullableValue<kj::Promise<void>_>::~NullableValue(&local_b8);
  local_a0.ptr = (MembranePolicyImpl *)0x0;
  local_58.disposer = (Disposer *)(pMVar3 + 1);
  local_58.ptr = pMVar3;
  membrane<capnp::_::(anonymous_namespace)::TestMembraneImpl>
            ((Client *)local_80,&local_90,&local_58);
  p_Var1 = *(_func_int **)((long)local_80 + -0x18);
  local_68.disposer = *(Disposer **)(local_80 + (long)p_Var1);
  local_68.ptr = *(ClientHook **)(p_Var1 + (long)(local_80 + 8));
  *(undefined8 *)(p_Var1 + (long)(local_80 + 8)) = 0;
  TwoPartyClient::TwoPartyClient(&this->server,connection,(Client *)&local_68,SERVER);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_68);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_80 + 8));
  kj::Own<capnp::MembranePolicy,_std::nullptr_t>::dispose(&local_58);
  kj::Own<capnp::_::(anonymous_namespace)::MembranePolicyImpl,_std::nullptr_t>::~Own(&local_a0);
  kj::Own<capnp::_::(anonymous_namespace)::TestMembraneImpl,_std::nullptr_t>::~Own(&local_90);
  TwoPartyClient::bootstrap((TwoPartyClient *)local_d0);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMembrane>
            (&this->membraned,(Client *)local_d0);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_d0);
  return;
}

Assistant:

TestRpcEnv(kj::Maybe<kj::Promise<void>> revokePromise = kj::none)
      : waitScope(loop),
        pipe(kj::newTwoWayPipe()),
        client(*pipe.ends[0]),
        server(*pipe.ends[1],
               membrane(kj::heap<TestMembraneImpl>(),
                        kj::refcounted<MembranePolicyImpl>(kj::mv(revokePromise))),
               rpc::twoparty::Side::SERVER),
        membraned(client.bootstrap().castAs<test::TestMembrane>()) {}